

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O1

void __thiscall libDAI::BoxBP::calcNewBox(BoxBP *this,FactorGraph *fg,size_t iI)

{
  pointer ppVar1;
  unsigned_long uVar2;
  pointer pvVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unsigned_long uVar5;
  undefined4 extraout_var_02;
  unsigned_long *puVar6;
  long lVar7;
  unsigned_long *puVar8;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> incoming;
  Box mjI;
  VarSet v_I;
  Var v_j;
  Var v_i;
  undefined1 local_178 [16];
  pointer local_168;
  size_t local_158;
  long local_150;
  BoxBP *local_148;
  unsigned_long local_140;
  Box local_138;
  VarSet local_e8;
  VarSet local_c8;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_a8;
  pointer local_90;
  Var local_88;
  Var local_78;
  TFactor<double> local_68;
  
  ppVar1 = (fg->_fg)._E12.
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140 = ppVar1[iI].first;
  uVar2 = ppVar1[iI].second;
  local_158 = iI;
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg);
  local_78._label = *(long *)CONCAT44(extraout_var,iVar4);
  local_78._states = ((long *)CONCAT44(extraout_var,iVar4))[1];
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar2);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            (&local_a8,
             (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)CONCAT44(extraout_var_00,iVar4));
  local_90 = ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)CONCAT44(extraout_var_00,iVar4))
             [1].super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_178 = ZEXT816(0) << 0x40;
  local_168 = (pointer)0x0;
  pvVar3 = (fg->_fg)._nb2.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = uVar2 * 3;
  puVar8 = pvVar3[uVar2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar8 != pvVar3[uVar2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    local_150 = lVar7;
    local_148 = this;
    do {
      if (*puVar8 != local_140) {
        iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])(fg,*puVar8);
        local_88._label = *(long *)CONCAT44(extraout_var_01,iVar4);
        local_88._states = ((long *)CONCAT44(extraout_var_01,iVar4))[1];
        VarSet::VarSet(&local_c8,&local_88);
        Box::Box(&local_138,&local_c8,1.0,1.0);
        if (local_c8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        this = local_148;
        uVar5 = *puVar8;
        pvVar3 = (fg->_fg)._nb1.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = pvVar3[uVar5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (puVar6 != pvVar3[uVar5].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          do {
            if (*puVar6 != uVar2) {
              Box::operator*=(&local_138,
                              (Box *)(*(long *)(*(long *)&(fg->_fg)._E12ind.
                                                                                                                    
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + *puVar6 * 8) *
                                      0x50 + *(long *)this));
            }
            puVar6 = puVar6 + 1;
            uVar5 = *puVar8;
          } while (puVar6 != (fg->_fg)._nb1.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar5].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        }
        std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
                  ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)local_178,&local_138);
        lVar7 = local_150;
        if (local_138._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138._max._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_138._max._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138._max._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_138._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138._min._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_138._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_138._min._p.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_138._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_138._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_138._vars._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != (&(((fg->_fg)._nb2.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish)[lVar7]);
  }
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar2);
  TFactor<double>::TFactor(&local_68,(TFactor<double> *)CONCAT44(extraout_var_02,iVar4));
  VarSet::VarSet(&local_e8,&local_78);
  boundSumProd(&local_138,&local_68,(vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)local_178,
               &local_e8,true,true);
  Box::operator=((Box *)(local_158 * 0x50 + *(long *)this),&local_138);
  if (local_138._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138._max._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138._max._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138._max._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138._min._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138._min._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138._min._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138._vars._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138._vars._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138._vars._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)local_178);
  if (local_a8.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BoxBP::calcNewBox( const FactorGraph &fg, size_t iI ) {
        size_t i = fg.edge(iI).first;
        size_t I = fg.edge(iI).second;
        Var v_i = fg.var(i);
        VarSet v_I = fg.factor(I).vars();

        vector<Box> incoming;
        for( FactorGraph::nb_cit j = fg.nbF(I).begin(); j != fg.nbF(I).end(); j++ )
            if( *j != i ) {
                Var v_j = fg.var(*j);
                Box mjI( v_j, 1.0, 1.0 );
                for( FactorGraph::nb_cit J = fg.nbV(*j).begin(); J != fg.nbV(*j).end(); J++ ) 
                    if( *J != I )
                        mjI *= box( fg, *j, *J );
                incoming.push_back( mjI );
            }
        _boxes[iI] = boundSumProd( fg.factor(I), incoming, v_i, true, true );
    }